

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipleofnumbers.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int __x;
  int iVar1;
  bool bVar2;
  istream *piVar3;
  reference pvVar4;
  ostream *poVar5;
  __type local_428;
  int local_41c;
  istringstream local_418 [8];
  istringstream ss;
  int local_284;
  int multN;
  int n;
  int x;
  vector<int,_std::allocator<int>_> nums;
  string token;
  string local_240 [8];
  string line;
  istream local_220 [8];
  ifstream stream;
  char **argv_local;
  int argc_local;
  
  std::ifstream::ifstream(local_220,argv[1],8);
  std::__cxx11::string::string(local_240);
  std::__cxx11::string::string
            ((string *)
             &nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&n);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_220,local_240);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    std::__cxx11::istringstream::istringstream(local_418,local_240,8);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_418,
                          (string *)
                          &nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,',');
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      local_41c = std::__cxx11::stoi((string *)
                                     &nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage,(size_t *)0x0,10);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&n,&local_41c);
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&n,1);
    __x = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&n,0);
    iVar1 = *pvVar4;
    local_428 = std::log2<int>(__x);
    bVar2 = isInt(&local_428);
    local_284 = __x;
    if (bVar2) {
      for (; local_284 <= iVar1; local_284 = __x + local_284) {
      }
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_284);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar5 = std::operator<<((ostream *)&std::cout,"Bad input");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&n);
    std::__cxx11::istringstream::~istringstream(local_418);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&n);
  std::__cxx11::string::~string
            ((string *)
             &nums.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::__cxx11::string::~string(local_240);
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
//    ifstream stream("/home/arkezar/nums");
    string line;
    string token;
    vector<int> nums;
    int x, n, multN;
    while (getline(stream, line)) {
        istringstream ss(line);
        while(getline(ss,token,',')){
            nums.push_back(stoi(token));
        }

        n = nums[1];
        x = nums[0];
        if(isInt(log2(n))) {
            multN = n;
            while (multN <= x) {
                multN += n;
            }

            cout << multN << endl;
        } else {
            cout << "Bad input" << endl;
        }
        nums.clear();
    }
    return 0;
}